

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_CCtx_setFParams(ZSTD_CCtx *cctx,ZSTD_frameParameters fparams)

{
  ZSTD_cStreamStage ZVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  ZVar1 = cctx->streamStage;
  uVar2 = 0xffffffffffffffc4;
  if (ZVar1 == zcss_init) {
    bVar4 = fparams.contentSizeFlag != 0;
    uVar2 = (ulong)bVar4;
    (cctx->requestedParams).fParams.contentSizeFlag = (uint)bVar4;
  }
  if (uVar2 < 0xffffffffffffff89) {
    uVar2 = 0xffffffffffffffc4;
    if (ZVar1 == zcss_init) {
      bVar4 = fparams._0_8_ >> 0x20 != 0;
      uVar2 = (ulong)bVar4;
      (cctx->requestedParams).fParams.checksumFlag = (uint)bVar4;
    }
    if (uVar2 < 0xffffffffffffff89) {
      uVar3 = 0xffffffffffffffc4;
      if (ZVar1 == zcss_init) {
        bVar4 = fparams.noDictIDFlag == 0;
        uVar3 = (ulong)bVar4;
        (cctx->requestedParams).fParams.noDictIDFlag = (uint)!bVar4;
      }
      uVar2 = 0;
      if (0xffffffffffffff88 < uVar3) {
        uVar2 = uVar3;
      }
    }
  }
  return uVar2;
}

Assistant:

size_t ZSTD_CCtx_setFParams(ZSTD_CCtx* cctx, ZSTD_frameParameters fparams)
{
    ZSTD_STATIC_ASSERT(sizeof(fparams) == 3 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setFParams");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_contentSizeFlag, fparams.contentSizeFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_checksumFlag, fparams.checksumFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_dictIDFlag, fparams.noDictIDFlag == 0), "");
    return 0;
}